

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::read_modify_write
               (bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool is8bit_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationSetMemoryLock);
  if (!is8bit) {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementData);
  }
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleStoreOrFetchDataThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  if (!is8bit) {
    std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleStoreDecrementData);
  }
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleStoreData);
  return;
}

Assistant:

static void read_modify_write(bool is8bit, const std::function<void(MicroOp)> &target) {
		target(OperationSetMemoryLock);					// Set the memory lock output until the end of this instruction.

		if(!is8bit)	target(CycleFetchIncrementData);	// Data low.
		target(CycleFetchData);							// Data [high].

		target(CycleStoreOrFetchDataThrowaway);			// Native mode: reread final byte of data.
														// Emulated mode: rewrite final byte of data.

		target(OperationPerform);						// Perform operation within the data buffer.

		if(!is8bit)	target(CycleStoreDecrementData);	// Data high.
		target(CycleStoreData);							// Data [low].
	}